

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TablePopBackgroundChannel(void)

{
  ImRect *pIVar1;
  ImVec4 *pIVar2;
  ImGuiTable *pIVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImGuiTableColumn *pIVar15;
  
  pIVar3 = GImGui->CurrentTable;
  if ((-1 < (long)pIVar3->CurrentColumn) &&
     (pIVar15 = (pIVar3->Columns).Data + pIVar3->CurrentColumn, pIVar15 < (pIVar3->Columns).DataEnd)
     ) {
    pIVar4 = GImGui->CurrentWindow;
    pIVar1 = &pIVar3->HostBackupInnerClipRect;
    IVar6 = (pIVar3->HostBackupInnerClipRect).Max;
    fVar11 = (pIVar1->Min).x;
    fVar12 = (pIVar1->Min).y;
    fVar13 = (pIVar3->HostBackupInnerClipRect).Max.x;
    fVar14 = (pIVar3->HostBackupInnerClipRect).Max.y;
    fVar7 = (pIVar1->Min).x;
    fVar8 = (pIVar1->Min).y;
    fVar9 = (pIVar3->HostBackupInnerClipRect).Max.x;
    fVar10 = (pIVar3->HostBackupInnerClipRect).Max.y;
    (pIVar4->ClipRect).Min = (pIVar3->HostBackupInnerClipRect).Min;
    (pIVar4->ClipRect).Max = IVar6;
    pIVar5 = pIVar4->DrawList;
    (pIVar5->_CmdHeader).ClipRect.x = fVar7;
    (pIVar5->_CmdHeader).ClipRect.y = fVar8;
    (pIVar5->_CmdHeader).ClipRect.z = fVar9;
    (pIVar5->_CmdHeader).ClipRect.w = fVar10;
    pIVar2 = (pIVar4->DrawList->_ClipRectStack).Data +
             (long)(pIVar4->DrawList->_ClipRectStack).Size + -1;
    pIVar2->x = fVar11;
    pIVar2->y = fVar12;
    pIVar2->z = fVar13;
    pIVar2->w = fVar14;
    ImDrawListSplitter::SetCurrentChannel
              (pIVar3->DrawSplitter,pIVar4->DrawList,(uint)pIVar15->DrawChannelCurrent);
    return;
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_internal.h"
                ,599,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
}

Assistant:

void ImGui::TablePopBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, table->HostBackupInnerClipRect);
    table->DrawSplitter->SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
}